

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDfs.c
# Opt level: O2

int Aig_ObjCollectSuper(Aig_Obj_t *pObj,Vec_Ptr_t *vSuper)

{
  byte *pbVar1;
  int iVar2;
  int iVar3;
  void *pvVar4;
  int i;
  
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Aig_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigDfs.c"
                  ,0x45a,"int Aig_ObjCollectSuper(Aig_Obj_t *, Vec_Ptr_t *)");
  }
  if (0xfffffffd < (*(uint *)&pObj->field_0x18 & 7) - 7) {
    vSuper->nSize = 0;
    iVar2 = Aig_ObjCollectSuper_rec(pObj,pObj,vSuper);
    iVar3 = vSuper->nSize;
    if (1 < iVar3) {
      for (i = 0; i < iVar3; i = i + 1) {
        pvVar4 = Vec_PtrEntry(vSuper,i);
        pbVar1 = (byte *)(((ulong)pvVar4 & 0xfffffffffffffffe) + 0x18);
        *pbVar1 = *pbVar1 & 0xef;
        iVar3 = vSuper->nSize;
      }
      if (iVar2 == -1) {
        vSuper->nSize = 0;
      }
      return iVar2;
    }
    __assert_fail("Vec_PtrSize(vSuper) > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigDfs.c"
                  ,0x45f,"int Aig_ObjCollectSuper(Aig_Obj_t *, Vec_Ptr_t *)");
  }
  __assert_fail("Aig_ObjIsNode(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigDfs.c"
                ,0x45b,"int Aig_ObjCollectSuper(Aig_Obj_t *, Vec_Ptr_t *)");
}

Assistant:

int Aig_ObjCollectSuper( Aig_Obj_t * pObj, Vec_Ptr_t * vSuper )
{
    int RetValue, i;
    assert( !Aig_IsComplement(pObj) );
    assert( Aig_ObjIsNode(pObj) );
    // collect the nodes in the implication supergate
    Vec_PtrClear( vSuper );
    RetValue = Aig_ObjCollectSuper_rec( pObj, pObj, vSuper );
    assert( Vec_PtrSize(vSuper) > 1 );
    // unmark the visited nodes
    Vec_PtrForEachEntry( Aig_Obj_t *, vSuper, pObj, i )
        Aig_Regular(pObj)->fMarkA = 0;
    // if we found the node and its complement in the same implication supergate, 
    // return empty set of nodes (meaning that we should use constant-0 node)
    if ( RetValue == -1 )
        vSuper->nSize = 0;
    return RetValue;
}